

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

void lys_type_free(ly_ctx *ctx,lys_type *type,_func_void_lys_node_ptr_void_ptr *private_destructor)

{
  void **ppvVar1;
  lys_type_bit *plVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  
  if (ctx == (ly_ctx *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                  ,0x8d6,
                  "void lys_type_free(struct ly_ctx *, struct lys_type *, void (*)(const struct lys_node *, void *))"
                 );
  }
  if (type == (lys_type *)0x0) {
switchD_00160958_caseD_3:
    return;
  }
  lys_extension_instances_free(ctx,type->ext,(uint)type->ext_size,private_destructor);
  switch(type->base) {
  case LY_TYPE_BINARY:
  case LY_TYPE_DEC64:
  case LY_TYPE_INT8:
  case LY_TYPE_UINT8:
  case LY_TYPE_INT16:
  case LY_TYPE_UINT16:
  case LY_TYPE_INT32:
  case LY_TYPE_UINT32:
  case LY_TYPE_INT64:
  case LY_TYPE_UINT64:
    lys_restr_free(ctx,(type->info).dec64.range,private_destructor);
    break;
  case LY_TYPE_BITS:
    if ((type->info).bits.count != 0) {
      lVar5 = 0;
      uVar4 = 0;
      do {
        lydict_remove(ctx,*(char **)((long)&((type->info).bits.bit)->name + lVar5));
        lydict_remove(ctx,*(char **)((long)&((type->info).bits.bit)->dsc + lVar5));
        lydict_remove(ctx,*(char **)((long)&((type->info).bits.bit)->ref + lVar5));
        plVar2 = (type->info).bits.bit;
        lys_iffeature_free(ctx,*(lys_iffeature **)((long)&plVar2->iffeature + lVar5),
                           (&plVar2->iffeature_size)[lVar5],0,private_destructor);
        plVar2 = (type->info).bits.bit;
        lys_extension_instances_free
                  (ctx,*(lys_ext_instance ***)((long)&plVar2->ext + lVar5),
                   (uint)(&plVar2->ext_size)[lVar5],private_destructor);
        uVar4 = uVar4 + 1;
        lVar5 = lVar5 + 0x30;
      } while (uVar4 < (type->info).bits.count);
    }
    break;
  default:
    goto switchD_00160958_caseD_3;
  case LY_TYPE_ENUM:
    if ((type->info).bits.count != 0) {
      lVar5 = 0;
      uVar4 = 0;
      do {
        lydict_remove(ctx,*(char **)((long)&((type->info).bits.bit)->name + lVar5));
        lydict_remove(ctx,*(char **)((long)&((type->info).bits.bit)->dsc + lVar5));
        lydict_remove(ctx,*(char **)((long)&((type->info).bits.bit)->ref + lVar5));
        plVar2 = (type->info).bits.bit;
        lys_iffeature_free(ctx,*(lys_iffeature **)((long)&plVar2->iffeature + lVar5),
                           (&plVar2->iffeature_size)[lVar5],0,private_destructor);
        plVar2 = (type->info).bits.bit;
        lys_extension_instances_free
                  (ctx,*(lys_ext_instance ***)((long)&plVar2->ext + lVar5),
                   (uint)(&plVar2->ext_size)[lVar5],private_destructor);
        uVar4 = uVar4 + 1;
        lVar5 = lVar5 + 0x30;
      } while (uVar4 < (type->info).bits.count);
    }
    break;
  case LY_TYPE_IDENT:
    break;
  case LY_TYPE_LEAFREF:
    lydict_remove(ctx,(type->info).lref.path);
    return;
  case LY_TYPE_STRING:
    lys_restr_free(ctx,(type->info).dec64.range,private_destructor);
    free((type->info).bits.bit);
    if ((type->info).str.pat_count != 0) {
      uVar3 = 1;
      lVar5 = 0;
      uVar4 = 0;
      do {
        lys_restr_free(ctx,(lys_restr *)(((type->info).lref.target)->padding + lVar5 + -0x1c),
                       private_destructor);
        ppvVar1 = (type->info).str.patterns_pcre;
        if (ppvVar1 != (void **)0x0) {
          (*_pcre_free)(ppvVar1[uVar3 - 1]);
          pcre_free_study((type->info).str.patterns_pcre[uVar3]);
        }
        uVar4 = uVar4 + 1;
        lVar5 = lVar5 + 0x38;
        uVar3 = uVar3 + 2;
      } while (uVar4 < (type->info).str.pat_count);
    }
    free((type->info).lref.target);
    plVar2 = (lys_type_bit *)(type->info).str.patterns_pcre;
    goto LAB_0016096d;
  case LY_TYPE_UNION:
    if ((type->info).bits.count != 0) {
      lVar5 = 0;
      uVar4 = 0;
      do {
        lys_type_free(ctx,(lys_type *)((long)&((type->info).bits.bit)->name + lVar5),
                      private_destructor);
        uVar4 = uVar4 + 1;
        lVar5 = lVar5 + 0x40;
      } while (uVar4 < (type->info).bits.count);
    }
  }
  plVar2 = (type->info).bits.bit;
LAB_0016096d:
  free(plVar2);
  return;
}

Assistant:

void
lys_type_free(struct ly_ctx *ctx, struct lys_type *type,
              void (*private_destructor)(const struct lys_node *node, void *priv))
{
    unsigned int i;

    assert(ctx);
    if (!type) {
        return;
    }

    lys_extension_instances_free(ctx, type->ext, type->ext_size, private_destructor);

    switch (type->base) {
    case LY_TYPE_BINARY:
        lys_restr_free(ctx, type->info.binary.length, private_destructor);
        free(type->info.binary.length);
        break;
    case LY_TYPE_BITS:
        for (i = 0; i < type->info.bits.count; i++) {
            lydict_remove(ctx, type->info.bits.bit[i].name);
            lydict_remove(ctx, type->info.bits.bit[i].dsc);
            lydict_remove(ctx, type->info.bits.bit[i].ref);
            lys_iffeature_free(ctx, type->info.bits.bit[i].iffeature, type->info.bits.bit[i].iffeature_size, 0,
                               private_destructor);
            lys_extension_instances_free(ctx, type->info.bits.bit[i].ext, type->info.bits.bit[i].ext_size,
                                         private_destructor);
        }
        free(type->info.bits.bit);
        break;

    case LY_TYPE_DEC64:
        lys_restr_free(ctx, type->info.dec64.range, private_destructor);
        free(type->info.dec64.range);
        break;

    case LY_TYPE_ENUM:
        for (i = 0; i < type->info.enums.count; i++) {
            lydict_remove(ctx, type->info.enums.enm[i].name);
            lydict_remove(ctx, type->info.enums.enm[i].dsc);
            lydict_remove(ctx, type->info.enums.enm[i].ref);
            lys_iffeature_free(ctx, type->info.enums.enm[i].iffeature, type->info.enums.enm[i].iffeature_size, 0,
                               private_destructor);
            lys_extension_instances_free(ctx, type->info.enums.enm[i].ext, type->info.enums.enm[i].ext_size,
                                         private_destructor);
        }
        free(type->info.enums.enm);
        break;

    case LY_TYPE_INT8:
    case LY_TYPE_INT16:
    case LY_TYPE_INT32:
    case LY_TYPE_INT64:
    case LY_TYPE_UINT8:
    case LY_TYPE_UINT16:
    case LY_TYPE_UINT32:
    case LY_TYPE_UINT64:
        lys_restr_free(ctx, type->info.num.range, private_destructor);
        free(type->info.num.range);
        break;

    case LY_TYPE_LEAFREF:
        lydict_remove(ctx, type->info.lref.path);
        break;

    case LY_TYPE_STRING:
        lys_restr_free(ctx, type->info.str.length, private_destructor);
        free(type->info.str.length);
        for (i = 0; i < type->info.str.pat_count; i++) {
            lys_restr_free(ctx, &type->info.str.patterns[i], private_destructor);
#ifdef LY_ENABLED_CACHE
            if (type->info.str.patterns_pcre) {
                pcre_free((pcre*)type->info.str.patterns_pcre[2 * i]);
                pcre_free_study((pcre_extra*)type->info.str.patterns_pcre[2 * i + 1]);
            }
#endif
        }
        free(type->info.str.patterns);
#ifdef LY_ENABLED_CACHE
        free(type->info.str.patterns_pcre);
#endif
        break;

    case LY_TYPE_UNION:
        for (i = 0; i < type->info.uni.count; i++) {
            lys_type_free(ctx, &type->info.uni.types[i], private_destructor);
        }
        free(type->info.uni.types);
        break;

    case LY_TYPE_IDENT:
        free(type->info.ident.ref);
        break;

    default:
        /* nothing to do for LY_TYPE_INST, LY_TYPE_BOOL, LY_TYPE_EMPTY */
        break;
    }
}